

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getEDDHPublicKey
          (SoftHSM *this,EDPublicKey *publicKey,EDPrivateKey *privateKey,ByteString *pubData)

{
  SoftHSM *this_00;
  CK_RV CVar1;
  ByteString data;
  
  if (privateKey == (EDPrivateKey *)0x0 || publicKey == (EDPublicKey *)0x0) {
    CVar1 = 7;
  }
  else {
    this_00 = (SoftHSM *)(**(code **)(*(long *)privateKey + 0x60))(privateKey);
    (**(code **)(*(long *)publicKey + 0x38))(publicKey);
    getECDHPubData(&data,this_00,pubData);
    (**(code **)(*(long *)publicKey + 0x40))(publicKey,&data);
    ByteString::~ByteString(&data);
    CVar1 = 0;
  }
  return CVar1;
}

Assistant:

CK_RV SoftHSM::getEDDHPublicKey(EDPublicKey* publicKey, EDPrivateKey* privateKey, ByteString& pubData)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setEC(privateKey->getEC());

	// Set value
	ByteString data = getECDHPubData(pubData);
	publicKey->setA(data);

	return CKR_OK;
}